

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncInfo.cpp
# Opt level: O2

void __thiscall FuncInfo::ReleaseLoad(FuncInfo *this,ParseNode *pnode)

{
  if (((ulong)pnode->nop < 0x3f) && ((0x4001800000000000U >> ((ulong)pnode->nop & 0x3f) & 1) != 0))
  {
    ReleaseReference(this,pnode);
  }
  ReleaseLoc(this,pnode);
  return;
}

Assistant:

void FuncInfo::ReleaseLoad(ParseNode *pnode)
{
    // Release any temp register(s) acquired by an EmitLoad.
    switch (pnode->nop)
    {
    case knopDot:
    case knopIndex:
    case knopCall:
        this->ReleaseReference(pnode);
        break;
    }
    this->ReleaseLoc(pnode);
}